

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

void anon_unknown.dwarf_ae8::ndiPSTATHelper(ndicapi *pol,char *command,char *commandReply)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int i;
  long lVar5;
  char (*pacVar6) [2];
  char *pcVar7;
  long lVar8;
  char (*pacVar9) [20];
  bool bVar10;
  char (*pacVar11) [32];
  int iVar12;
  long lVar13;
  char (*pacVar14) [8];
  
  uVar4 = 1;
  if (command[5] == ' ') {
    cVar2 = command[6];
  }
  else {
    if (command[5] != ':') goto LAB_00108dd3;
    cVar2 = command[10];
  }
  if (cVar2 != '\r') {
    lVar8 = 0;
    uVar4 = 0;
    do {
      cVar2 = command[lVar8 + 6];
      iVar12 = -0x57;
      if (((5 < (byte)(cVar2 + 0x9fU)) && (iVar12 = -0x37, 5 < (byte)(cVar2 + 0xbfU))) &&
         (iVar12 = -0x30, 9 < (byte)(cVar2 - 0x30U))) break;
      uVar4 = uVar4 << 4 | iVar12 + cVar2;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
  }
LAB_00108dd3:
  pacVar11 = pol->PstatBasic;
  lVar8 = 0;
  pacVar9 = pol->PstatPartNumber;
  pacVar14 = pol->PstatTesting;
  do {
    if ((uVar4 & 1) != 0) {
      lVar5 = 0;
      do {
        if (commandReply[lVar5] < ' ') {
          (*pacVar11)[lVar5] = '\0';
          break;
        }
        (*pacVar11)[lVar5] = commandReply[lVar5];
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 0x20);
      commandReply = commandReply + lVar5;
    }
    if ((uVar4 & 2) != 0) {
      pol->PstatTesting[lVar8][0] = '\0';
      lVar5 = 0;
      do {
        if (commandReply[lVar5] < ' ') break;
        (*pacVar14)[lVar5] = commandReply[lVar5];
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 8);
      commandReply = commandReply + lVar5;
    }
    if ((uVar4 & 4) != 0) {
      pol->PstatPartNumber[lVar8][0] = '\0';
      lVar5 = 0;
      do {
        if (commandReply[lVar5] < ' ') break;
        (*pacVar9)[lVar5] = commandReply[lVar5];
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 0x14);
      commandReply = commandReply + lVar5;
    }
    if ((uVar4 & 8) != 0) {
      pacVar6 = pol->PstatAccessories + lVar8;
      (*pacVar6)[0] = '\0';
      bVar3 = true;
      do {
        bVar10 = bVar3;
        cVar2 = *commandReply;
        if (cVar2 < ' ') break;
        commandReply = commandReply + 1;
        (*pacVar6)[0] = cVar2;
        pacVar6 = (char (*) [2])(*pacVar6 + 1);
        bVar3 = false;
      } while (bVar10);
    }
    if ((uVar4 & 0x10) != 0) {
      pacVar6 = pol->PstatMarkerType + lVar8;
      (*pacVar6)[0] = '\0';
      bVar3 = true;
      do {
        bVar10 = bVar3;
        cVar2 = *commandReply;
        if (cVar2 < ' ') break;
        commandReply = commandReply + 1;
        (*pacVar6)[0] = cVar2;
        pacVar6 = (char (*) [2])(*pacVar6 + 1);
        bVar3 = false;
      } while (bVar10);
    }
    pcVar7 = commandReply + -1;
    do {
      cVar2 = pcVar7[1];
      pcVar7 = pcVar7 + 1;
    } while ('\x1f' < cVar2);
    commandReply = pcVar7 + (cVar2 == '\n');
    lVar8 = lVar8 + 1;
    pacVar11 = pacVar11 + 1;
    pacVar14 = pacVar14 + 1;
    pacVar9 = pacVar9 + 1;
  } while (lVar8 != 3);
  if ((short)uVar4 < 0) {
    pcVar7 = pcVar7 + (cVar2 == '\n');
    lVar8 = 9;
    if ((uVar4 >> 0xd & 1) == 0) {
      lVar8 = 3;
    }
    lVar5 = 0;
    pacVar9 = pol->PstatPassivePartNumber;
    pacVar14 = pol->PstatPassiveTesting;
    pacVar11 = pol->PstatPassiveBasic;
    do {
      if ((uVar4 & 1) != 0) {
        pol->PstatPassiveBasic[lVar5][0] = '\0';
        lVar13 = 0;
        do {
          if (pcVar7[lVar13] < ' ') {
            (*pacVar11)[lVar13] = '\0';
            break;
          }
          (*pacVar11)[lVar13] = pcVar7[lVar13];
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 != 0x20);
        pcVar7 = pcVar7 + lVar13;
      }
      if ((uVar4 & 2) != 0) {
        pol->PstatPassiveTesting[lVar5][0] = '\0';
        lVar13 = 0;
        do {
          if (pcVar7[lVar13] < ' ') break;
          (*pacVar14)[lVar13] = pcVar7[lVar13];
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 != 8);
        pcVar7 = pcVar7 + lVar13;
      }
      if ((uVar4 & 4) != 0) {
        pol->PstatPassivePartNumber[lVar5][0] = '\0';
        lVar13 = 0;
        do {
          if (pcVar7[lVar13] < ' ') break;
          (*pacVar9)[lVar13] = pcVar7[lVar13];
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 != 0x14);
        pcVar7 = pcVar7 + lVar13;
      }
      if ((uVar4 & 8) != 0) {
        pacVar6 = pol->PstatPassiveAccessories + lVar5;
        (*pacVar6)[0] = '\0';
        bVar3 = true;
        do {
          bVar10 = bVar3;
          cVar2 = *pcVar7;
          if (cVar2 < ' ') break;
          pcVar7 = pcVar7 + 1;
          (*pacVar6)[0] = cVar2;
          pacVar6 = (char (*) [2])(*pacVar6 + 1);
          bVar3 = false;
        } while (bVar10);
      }
      if ((uVar4 & 0x10) != 0) {
        pacVar6 = pol->PstatPassiveMarkerType + lVar5;
        (*pacVar6)[0] = '\0';
        bVar3 = true;
        do {
          bVar10 = bVar3;
          cVar2 = *pcVar7;
          if (cVar2 < ' ') break;
          pcVar7 = pcVar7 + 1;
          (*pacVar6)[0] = cVar2;
          pacVar6 = (char (*) [2])(*pacVar6 + 1);
          bVar3 = false;
        } while (bVar10);
      }
      pcVar7 = pcVar7 + -1;
      do {
        pcVar1 = pcVar7 + 1;
        pcVar7 = pcVar7 + 1;
      } while ('\x1f' < *pcVar1);
      pcVar7 = pcVar7 + (*pcVar1 == '\n');
      lVar5 = lVar5 + 1;
      pacVar11 = pacVar11 + 1;
      pacVar14 = pacVar14 + 1;
      pacVar9 = pacVar9 + 1;
    } while (lVar5 != lVar8);
  }
  return;
}

Assistant:

void ndiPSTATHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    char* writePointer;
    int i, j;
    int passiveCount, activeCount;

    // if the PSTAT command had a reply mode, read it
    if ((command[5] == ':' && command[10] != '\r') || (command[5] == ' ' && command[6] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[6], 4);
    }

    // always three active ports
    activeCount = 3;

    // information for each port is separated by a newline
    for (i = 0; i < activeCount; i++)
    {
      // basic tool information and port status
      if (mode & NDI_BASIC)
      {
        writePointer = pol->PstatBasic[i];
        for (j = 0; j < 32 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        // terminate if UNOCCUPIED
        if (j < 32)
        {
          *writePointer = '\0';
        }
      }

      // current testing
      if (mode & NDI_TESTING)
      {
        writePointer = pol->PstatTesting[i];
        *writePointer = '\0';
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // part number
      if (mode & NDI_PART_NUMBER)
      {
        writePointer = pol->PstatPartNumber[i];
        *writePointer = '\0';
        for (j = 0; j < 20 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // accessories
      if (mode & NDI_ACCESSORIES)
      {
        writePointer = pol->PstatAccessories[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // marker type
      if (mode & NDI_MARKER_TYPE)
      {
        writePointer = pol->PstatMarkerType[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // skip any other information that might be present
      while (*commandReply >= ' ')
      {
        commandReply++;
      }

      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    // if there is no passive information, stop here
    if (!(mode & NDI_PASSIVE))
    {
      return;
    }

    // in case there are 9 passive tools instead of just 3
    passiveCount = 3;
    if (mode & NDI_PASSIVE_EXTRA)
    {
      passiveCount = 9;
    }

    // information for each port is separated by a newline
    for (i = 0; i < passiveCount; i++)
    {
      // basic tool information and port status
      if (mode & NDI_BASIC)
      {
        writePointer = pol->PstatPassiveBasic[i];
        *writePointer = '\0';
        for (j = 0; j < 32 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        // terminate if UNOCCUPIED
        if (j < 32)
        {
          *writePointer = '\0';
        }
      }

      // current testing
      if (mode & NDI_TESTING)
      {
        writePointer = pol->PstatPassiveTesting[i];
        *writePointer = '\0';
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // part number
      if (mode & NDI_PART_NUMBER)
      {
        writePointer = pol->PstatPassivePartNumber[i];
        *writePointer = '\0';
        for (j = 0; j < 20 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // accessories
      if (mode & NDI_ACCESSORIES)
      {
        writePointer = pol->PstatPassiveAccessories[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // marker type
      if (mode & NDI_MARKER_TYPE)
      {
        writePointer = pol->PstatPassiveMarkerType[i];
        *writePointer = '\0';
        for (j = 0; j < 2 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // skip any other information that might be present
      while (*commandReply >= ' ')
      {
        commandReply++;
      }

      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }
  }